

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

void __thiscall Arg::print(Arg *this,ostream *o)

{
  Functor local_40;
  
  if (this->tag != Register) {
    if (this->tag == Functor) {
      Functor::Functor(&local_40,&this->f_);
      Functor::print(&local_40,o);
      std::__cxx11::string::~string((string *)&local_40);
    }
    return;
  }
  operator<<(o,(Register)(this->r_).r);
  return;
}

Assistant:

void print(std::ostream &o) const {
        switch(tag) {
            case ArgTag::Functor: o << f_; return;
            case ArgTag::Register: o << r_; return;
        }

    }